

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_pipeline.cc
# Opt level: O0

void consume<long,disruptor::SingleThreadedStrategy,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
                *s,unique_ptr<disruptor::SequenceBarrier<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>_>_>
                   *barrier,Sequence *seq)

{
  Sequence *this;
  long *plVar1;
  int64_t ev;
  int64_t i;
  int64_t available_seq;
  int64_t locaSum;
  int exitCtr;
  int64_t next_seq;
  int64_t *in_stack_ffffffffffffff48;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
  *in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  long local_88;
  undefined4 in_stack_ffffffffffffff80;
  int iVar2;
  duration<long,std::ratio<1l,1000000l>> local_78 [12];
  int local_6c;
  duration<long,std::ratio<1l,1000000l>> local_68 [8];
  int64_t local_60;
  long local_58;
  int local_4c;
  long local_48;
  
  local_48 = 0;
  local_4c = 0;
  local_58 = 0;
  while( true ) {
    while( true ) {
      do {
        this = (Sequence *)
               std::
               unique_ptr<disruptor::SequenceBarrier<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>_>_>
               ::operator->((unique_ptr<disruptor::SequenceBarrier<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>_>_>
                             *)0x15ce35);
        local_6c = 10000;
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_68,&local_6c);
        local_60 = disruptor::
                   SequenceBarrier<disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
                   ::WaitFor<long,std::ratio<1l,1000000l>>
                             ((SequenceBarrier<disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>_>
                               *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                              (duration<long,_std::ratio<1L,_1000000L>_> *)0x15ce65);
      } while (local_60 < local_48);
      local_60 = disruptor::
                 Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
                 ::GetHighestPublishedSequence
                           (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48,0x15ce8f);
      if (local_48 <= local_60) break;
      local_4c = local_4c + 1;
      if (10 < local_4c) {
        iVar2 = 1;
        std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
                  (local_78,(int *)&stack0xffffffffffffff84);
        std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                  ((duration<long,_std::ratio<1L,_1000000L>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffff80));
      }
    }
    for (local_88 = local_48; local_88 <= local_60; local_88 = local_88 + 1) {
      plVar1 = disruptor::
               Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
               ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_58 = *plVar1 + local_58;
    }
    disruptor::Sequence::set_sequence(this,in_stack_ffffffffffffff58);
    if (local_60 == expectedValue) break;
    local_48 = local_60 + 1;
    local_4c = 0;
  }
  LOCK();
  sum.super___atomic_base<long>._M_i =
       (__atomic_base<long>)
       (__atomic_base<long>)(sum.super___atomic_base<long>._M_i + local_58)._M_i;
  UNLOCK();
  return;
}

Assistant:

void consume(disruptor::Sequencer<T, C, W>& s,
             std::unique_ptr<disruptor::SequenceBarrier<W> > barrier,
             disruptor::Sequence& seq) {
  int64_t next_seq = disruptor::kFirstSequenceValue;

  int exitCtr = 0;

  int64_t locaSum = 0;

  while (true) {
#ifdef PRINT_DEBUG_CONS
    std::stringstream ss;
    ss << "Wait for next seq: " << next_seq << ' ' << std::this_thread::get_id()
       << '\n';
    std::cout << ss.str();
#endif

    int64_t available_seq =
        barrier->WaitFor(next_seq, std::chrono::microseconds(10000));

#ifdef PRINT_DEBUG_CONS
    ss.clear();
    ss.str(std::string());
    ss << "Available seq: " << available_seq << ' '
       << std::this_thread::get_id() << '\n';
    std::cout << ss.str();
#endif

    if (available_seq < next_seq) continue;

    // Only required for claim strategy MultiThreadedStrategyEx as it changes
    // the cursor.
    available_seq = s.GetHighestPublishedSequence(next_seq, available_seq);
    if (available_seq < next_seq) {
      ++exitCtr;

#ifdef PRINT_DEBUG_CONS
      ss.clear();
      ss.str(std::string());
      ss << "Highest published seq: " << available_seq << ' '
         << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
      // Otherwise goes into a busy loop with blocking strategy
      if (exitCtr > 10)
        std::this_thread::sleep_for(std::chrono::microseconds(1));
      continue;
    }

    for (int64_t i = next_seq; i <= available_seq; ++i) {
      int64_t ev = s[i];
#ifdef PRINT_DEBUG_CONS
      std::cout << i << " Event: " << ev << '\n';
#endif
      locaSum += ev;
    }

    seq.set_sequence(available_seq);

    if (available_seq == expectedValue)
      break;

    next_seq = available_seq + 1;

    exitCtr = 0;
  }

  sum.fetch_add(locaSum, std::memory_order_relaxed);
}